

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_models_md3.cpp
# Opt level: O2

void __thiscall
FMD3Model::RenderFrame
          (FMD3Model *this,FTexture *skin,int frameno,int frameno2,double inter,int translation)

{
  FTextureID texnum;
  uint size;
  int iVar1;
  MD3Surface *pMVar2;
  FTexture *tex;
  FMaterial *mat;
  long lVar3;
  int i;
  long lVar4;
  
  if (frameno2 < this->numFrames && frameno < this->numFrames) {
    gl_RenderState.mInterpolationFactor = (float)inter;
    lVar3 = 0;
    for (lVar4 = 0; lVar4 < this->numSurfaces; lVar4 = lVar4 + 1) {
      pMVar2 = this->surfaces;
      tex = skin;
      if (skin == (FTexture *)0x0) {
        texnum.texnum =
             ((this->super_FModel).curSpriteMDLFrame)->surfaceskinIDs
             [(this->super_FModel).curMDLIndex][lVar4].texnum;
        if (texnum.texnum < 1) {
          if (*(int *)((long)&pMVar2->numSkins + lVar3) < 1) {
            return;
          }
          texnum.texnum = **(int **)((long)&pMVar2->skins + lVar3);
          if (texnum.texnum < 1) {
            return;
          }
        }
        tex = FTextureManager::operator()(&TexMan,texnum,false);
        if (tex == (FTexture *)0x0) {
          return;
        }
      }
      mat = FMaterial::ValidateTexture(tex,false);
      FRenderState::SetMaterial(&gl_RenderState,mat,0,translation,-1,false);
      FRenderState::Apply(&gl_RenderState);
      size = *(uint *)((long)&pMVar2->numVertices + lVar3);
      iVar1 = *(int *)((long)&pMVar2->vindex + lVar3);
      FModelVertexBuffer::SetupFrame
                ((this->super_FModel).mVBuf,size * frameno + iVar1,size * frameno2 + iVar1,size);
      (*_ptrc_glDrawElements)
                (4,*(int *)((long)&pMVar2->numTriangles + lVar3) * 3,0x1405,
                 (void *)((ulong)*(uint *)((long)&pMVar2->iindex + lVar3) << 2));
      lVar3 = lVar3 + 0x38;
    }
    gl_RenderState.mInterpolationFactor = 0.0;
  }
  return;
}

Assistant:

void FMD3Model::RenderFrame(FTexture * skin, int frameno, int frameno2, double inter, int translation)
{
	if (frameno>=numFrames || frameno2>=numFrames) return;

	gl_RenderState.SetInterpolationFactor((float)inter);
	for(int i=0;i<numSurfaces;i++)
	{
		MD3Surface * surf = &surfaces[i];

		// [BB] In case no skin is specified via MODELDEF, check if the MD3 has a skin for the current surface.
		// Note: Each surface may have a different skin.
		FTexture *surfaceSkin = skin;
		if (!surfaceSkin)
		{
			if (curSpriteMDLFrame->surfaceskinIDs[curMDLIndex][i].isValid())
			{
				surfaceSkin = TexMan(curSpriteMDLFrame->surfaceskinIDs[curMDLIndex][i]);
			}
			else if(surf->numSkins > 0 && surf->skins[0].isValid())
			{
				surfaceSkin = TexMan(surf->skins[0]);
			}

			if (!surfaceSkin) return;
		}

		FMaterial * tex = FMaterial::ValidateTexture(surfaceSkin, false);

		gl_RenderState.SetMaterial(tex, CLAMP_NONE, translation, -1, false);

		gl_RenderState.Apply();
		mVBuf->SetupFrame(surf->vindex + frameno * surf->numVertices, surf->vindex + frameno2 * surf->numVertices, surf->numVertices);
		glDrawElements(GL_TRIANGLES, surf->numTriangles * 3, GL_UNSIGNED_INT, (void*)(intptr_t)(surf->iindex * sizeof(unsigned int)));
	}
	gl_RenderState.SetInterpolationFactor(0.f);
}